

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

size_t file_read(png_t *png,void *out,size_t size,size_t numel)

{
  uint uVar1;
  int iVar2;
  size_t in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t result;
  undefined8 local_28;
  
  if (*(long *)(in_RDI + 8) == 0) {
    if (in_RSI == (void *)0x0) {
      iVar2 = fseek(*(FILE **)(in_RDI + 0x18),in_RDX * in_RCX,1);
      local_28 = (ulong)iVar2;
    }
    else {
      local_28 = fread(in_RSI,in_RDX,in_RCX,*(FILE **)(in_RDI + 0x18));
    }
  }
  else {
    uVar1 = (**(code **)(in_RDI + 8))(in_RSI,in_RDX,in_RCX,*(undefined8 *)(in_RDI + 0x18));
    local_28 = (ulong)uVar1;
  }
  return local_28;
}

Assistant:

static size_t file_read(png_t* png, void* out, size_t size, size_t numel)
{
	size_t result;
	if(png->read_fun)
	{
		result = png->read_fun(out, size, numel, png->user_pointer);
	}
	else
	{
		if(!out)
		{
			result = fseek(png->user_pointer, (long)(size*numel), SEEK_CUR);
		}
		else
		{
			result = fread(out, size, numel, png->user_pointer);
		}
	}

	return result;
}